

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_event_loop.cpp
# Opt level: O2

void __thiscall sock2::operator()(sock2 *this,error_code *e)

{
  int iVar1;
  ostream *poVar2;
  ssize_t sVar3;
  char c;
  
  if (e->_M_value != 0) {
    poVar2 = std::operator<<((ostream *)&std::cerr,"Fail: ");
    poVar2 = std::operator<<(poVar2,"!e");
    poVar2 = std::operator<<(poVar2," at ");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,0x42);
    std::endl<char,std::char_traits<char>>(poVar2);
    return_code = 1;
  }
  iVar1 = this->counter;
  this->counter = iVar1 + 1;
  c = (char)iVar1;
  sVar3 = send(this->fd,&c,1,0);
  if ((int)sVar3 != 1) {
    poVar2 = std::operator<<((ostream *)&std::cerr,"Fail: ");
    poVar2 = std::operator<<(poVar2,"n==1");
    poVar2 = std::operator<<(poVar2," at ");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,0x45);
    std::endl<char,std::char_traits<char>>(poVar2);
    return_code = 1;
  }
  if (this->counter == 10) {
    shutdown(this->fd,2);
  }
  else {
    async_run(this);
  }
  return;
}

Assistant:

void operator()(booster::system::error_code const &e)
	{
		TEST(!e);
		char c=counter++;
		int n = ::send(fd,&c,1,0);
		TEST(n==1);
		if(counter == 10) {
			#ifdef SHUT_RDWR
			shutdown(fd,SHUT_RDWR);
			#else
			shutdown(fd,SD_BOTH);
			#endif
		}
		else  {
			async_run();
		}

	}